

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnView::setColumnWidths(QColumnView *this,QList<int> *list)

{
  QList<int> *this_00;
  int iVar1;
  long lVar2;
  ulong uVar3;
  QWidget *this_01;
  QWidgetData *pQVar4;
  int iVar5;
  pointer piVar6;
  long lVar7;
  long asize;
  ulong uVar8;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  uVar3 = (list->d).size;
  iVar5 = (int)uVar3;
  asize = (long)iVar5;
  lVar7 = *(long *)(lVar2 + 0x550);
  if (asize <= *(long *)(lVar2 + 0x550)) {
    lVar7 = asize;
  }
  if ((int)(uint)lVar7 < 1) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    do {
      this_01 = *(QWidget **)(*(long *)(lVar2 + 0x548) + uVar8 * 8);
      pQVar4 = this_01->data;
      local_40.wd.m_i = (list->d).ptr[uVar8];
      local_40.ht.m_i = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1;
      QWidget::resize(this_01,&local_40);
      iVar1 = (list->d).ptr[uVar8];
      piVar6 = QList<int>::data((QList<int> *)(lVar2 + 0x558));
      piVar6[uVar8] = iVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)lVar7 & 0x7fffffff) != uVar8);
  }
  this_00 = (QList<int> *)(lVar2 + 0x558);
  QList<int>::reserve(this_00,asize);
  if ((int)uVar8 < iVar5) {
    uVar8 = uVar8 & 0xffffffff;
    do {
      local_40.wd.m_i = (list->d).ptr[uVar8];
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)this_00,*(qsizetype *)(lVar2 + 0x568),(int *)&local_40);
      QList<int>::end(this_00);
      uVar8 = uVar8 + 1;
    } while ((uVar3 & 0xffffffff) != uVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::setColumnWidths(const QList<int> &list)
{
    Q_D(QColumnView);
    int i = 0;
    const int listCount = list.size();
    const int count = qMin(listCount, d->columns.size());
    for (; i < count; ++i) {
        d->columns.at(i)->resize(list.at(i), d->columns.at(i)->height());
        d->columnSizes[i] = list.at(i);
    }

    d->columnSizes.reserve(listCount);
    for (; i < listCount; ++i)
        d->columnSizes.append(list.at(i));
}